

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

void __thiscall jbcoin::STObject::STObject(STObject *this,SerialIter *sit,SField *name)

{
  SField *name_local;
  SerialIter *sit_local;
  STObject *this_local;
  
  STBase::STBase(&this->super_STBase,name);
  CountedObject<jbcoin::STObject>::CountedObject((CountedObject<jbcoin::STObject> *)this);
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STObject_0051a068;
  std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::vector(&this->v_);
  this->mType = (SOTemplate *)0x0;
  set(this,sit,0);
  return;
}

Assistant:

STObject::STObject (SerialIter& sit, SField const& name)
    : STBase(name)
    , mType(nullptr)
{
    set(sit, 0);
}